

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G1.c
# Opt level: O0

void copy_conditional(unsigned_long *dst,unsigned_long *src,unsigned_long move)

{
  ulong uVar1;
  ulong uVar2;
  unsigned_long mask2;
  unsigned_long mask1;
  unsigned_long move_local;
  unsigned_long *src_local;
  unsigned_long *dst_local;
  
  uVar1 = -move;
  uVar2 = uVar1 ^ 0xffffffffffffffff;
  *dst = *src & uVar1 ^ *dst & uVar2;
  dst[1] = src[1] & uVar1 ^ dst[1] & uVar2;
  dst[2] = src[2] & uVar1 ^ dst[2] & uVar2;
  dst[3] = src[3] & uVar1 ^ dst[3] & uVar2;
  return;
}

Assistant:

static void copy_conditional(BN_ULONG dst[N_LIMBS],
                             const BN_ULONG src[N_LIMBS], BN_ULONG move)
{
    BN_ULONG mask1 = 0-move;
    BN_ULONG mask2 = ~mask1;

    dst[0] = (src[0] & mask1) ^ (dst[0] & mask2);
    dst[1] = (src[1] & mask1) ^ (dst[1] & mask2);
    dst[2] = (src[2] & mask1) ^ (dst[2] & mask2);
    dst[3] = (src[3] & mask1) ^ (dst[3] & mask2);
    if (N_LIMBS == 8) {
        dst[4] = (src[4] & mask1) ^ (dst[4] & mask2);
        dst[5] = (src[5] & mask1) ^ (dst[5] & mask2);
        dst[6] = (src[6] & mask1) ^ (dst[6] & mask2);
        dst[7] = (src[7] & mask1) ^ (dst[7] & mask2);
    }
}